

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_address-inl.h
# Opt level: O2

bool anon_unknown.dwarf_5b8a2::CheckAccessSingleSyscall(uintptr_t addr,int pagesize)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  
  if ((addr & 0xfffffffffffffff0) == 0) {
    bVar3 = false;
  }
  else {
    lVar1 = syscall(0xe,0xffffffffffffffff,addr & 0xfffffffffffffff0,0,8);
    if (-1 < (int)lVar1) {
      syscall(1,2,"Check failed: rv < 0: sigprocmask(~0, addr, ...)\n",0x31);
      abort();
    }
    piVar2 = __errno_location();
    bVar3 = *piVar2 != 0xe;
  }
  return bVar3;
}

Assistant:

bool CheckAccessSingleSyscall(uintptr_t addr, int pagesize) {
  addr &= ~uintptr_t{15};

  if (addr == 0) {
    return false;
  }

  int rv = syscall(SYS_rt_sigprocmask, ~0, addr, uintptr_t{0}, kKernelSigSetSize);
  RAW_CHECK(rv < 0, "sigprocmask(~0, addr, ...)");

  return (errno != EFAULT);
}